

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTokenTestTwoCommandsInParallel::Run(BuildTokenTestTwoCommandsInParallel *this)

{
  Builder *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  bool condition;
  Node *pNVar4;
  allocator<char> local_69;
  string err;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTokenTest).super_BuildTest.super_StateTestWithBuiltinRules.state_,
              "rule token-available\n  command = cat $in > $out\nbuild out1: token-available in1\nbuild out2: token-available in2\nbuild out12: cat out1 out2\n"
              ,(ManifestParserOptions)0x0);
  pTVar2 = g_current_test;
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out12",&local_69);
  this_00 = &(this->super_BuildTokenTest).super_BuildTest.builder_;
  pNVar4 = Builder::AddTarget(this_00,&local_48,&err);
  testing::Test::Check
            (pTVar2,pNVar4 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10b1,"builder_.AddTarget(\"out12\", &err)");
  std::__cxx11::string::~string((string *)&local_48);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x10b2,"\"\" == err");
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_0013eacf;
  }
  BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,4,1,1,1,0);
  BuildTokenTest::ExpectAcquireToken(&this->super_BuildTokenTest,3,1,0,1);
  BuildTokenTest::ExpectWaitForCommand(&this->super_BuildTokenTest,3,1,0,0);
  pTVar2 = g_current_test;
  bVar3 = Builder::Build(this_00,&err);
  testing::Test::Check
            (pTVar2,!bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10bd,"builder_.Build(&err)");
  pTVar2 = g_current_test;
  bVar3 = std::operator==("stuck [this is a bug]",&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10be,"\"stuck [this is a bug]\" == err");
  testing::Test::Check
            (g_current_test,
             (long)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0x40,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10c0,"2u == token_command_runner_.commands_ran_.size()");
  pTVar2 = g_current_test;
  bVar3 = std::operator==((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"cat in1 > out1");
  if (bVar3) {
    bVar3 = std::operator==((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1,"cat in2 > out2");
    condition = true;
    if (!bVar3) goto LAB_0013ea6e;
  }
  else {
LAB_0013ea6e:
    bVar3 = std::operator==((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"cat in2 > out2");
    if (bVar3) {
      condition = std::operator==((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1,"cat in1 > out1");
    }
    else {
      condition = false;
    }
  }
  testing::Test::Check
            (pTVar2,condition,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10c4,
             "(token_command_runner_.commands_ran_[0] == \"cat in1 > out1\" && token_command_runner_.commands_ran_[1] == \"cat in2 > out2\") || (token_command_runner_.commands_ran_[0] == \"cat in2 > out2\" && token_command_runner_.commands_ran_[1] == \"cat in1 > out1\")"
            );
LAB_0013eacf:
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(BuildTokenTest, TwoCommandsInParallel) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule token-available\n"
"  command = cat $in > $out\n"
"build out1: token-available in1\n"
"build out2: token-available in2\n"
"build out12: cat out1 out2\n"));

  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("out12", &err));
  ASSERT_EQ("", err);

  // 1st command: token available -> allow running
  // 2nd command: no token available but becomes available later
  ExpectCanRunMore(4,     true, true,  true,  false);
  ExpectAcquireToken(3,   true, false, true);
  // 1st call waits for command to finalize or token to become available
  // 2nd call waits for command to finalize
  // 3rd call waits for command to finalize
  ExpectWaitForCommand(3, true, false, false);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("stuck [this is a bug]", err);

  EXPECT_EQ(2u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > out1" &&
               token_command_runner_.commands_ran_[1] == "cat in2 > out2") ||
              (token_command_runner_.commands_ran_[0] == "cat in2 > out2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > out1"));
}